

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Transaction::GetTotalSize(Transaction *this)

{
  void *pvVar1;
  wally_tx *tx_pointer;
  size_t length;
  Transaction *this_local;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    tx_pointer._0_4_ = 10;
  }
  else {
    tx_pointer._0_4_ = AbstractTransaction::GetTotalSize(&this->super_AbstractTransaction);
  }
  return (uint32_t)tx_pointer;
}

Assistant:

uint32_t Transaction::GetTotalSize() const {
  size_t length = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    length = static_cast<size_t>(kTransactionMinimumSize);
  } else {
    length = AbstractTransaction::GetTotalSize();
  }
  return static_cast<uint32_t>(length);
}